

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

void __thiscall icu_63::DNCache::DNCache(DNCache *this,Locale *_locale)

{
  UHashtable *fillinResult;
  UErrorCode status;
  UErrorCode local_2c;
  
  (this->cache).hash = (UHashtable *)0x0;
  local_2c = U_ZERO_ERROR;
  fillinResult = &(this->cache).hashObj;
  uhash_init_63(fillinResult,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,
                (undefined1 *)0x0,&local_2c);
  if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
    (this->cache).hash = fillinResult;
    uhash_setKeyDeleter_63(fillinResult,uprv_deleteUObject_63);
  }
  Locale::Locale(&this->locale,_locale);
  return;
}

Assistant:

DNCache(const Locale& _locale) 
        : cache(), locale(_locale) 
    {
        // cache.setKeyDeleter(uprv_deleteUObject);
    }